

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O1

pool_ptr<soul::heart::Variable> __thiscall
soul::Module::StateVariables::find(StateVariables *this,string_view name)

{
  bool bVar1;
  pool_ref<soul::heart::Variable> *ppVar2;
  char *in_RCX;
  long *plVar3;
  long lVar4;
  bool bVar5;
  string_view other;
  string_view other_00;
  
  lVar4 = ((undefined8 *)name._M_len)[1];
  bVar5 = lVar4 == 0;
  if (!bVar5) {
    plVar3 = *(long **)name._M_len;
    other._M_str = in_RCX;
    other._M_len = (size_t)name._M_str;
    bVar1 = Identifier::operator==((Identifier *)(*plVar3 + 0x30),other);
    if (!bVar1) {
      lVar4 = lVar4 * 8;
      do {
        lVar4 = lVar4 + -8;
        bVar5 = lVar4 == 0;
        if (bVar5) goto LAB_001cbb00;
        plVar3 = plVar3 + 1;
        other_00._M_str = in_RCX;
        other_00._M_len = (size_t)name._M_str;
        bVar1 = Identifier::operator==((Identifier *)(*plVar3 + 0x30),other_00);
      } while (!bVar1);
    }
    if (!bVar5) {
      ppVar2 = (pool_ref<soul::heart::Variable> *)*plVar3;
      goto LAB_001cbb08;
    }
  }
LAB_001cbb00:
  ppVar2 = (pool_ref<soul::heart::Variable> *)0x0;
LAB_001cbb08:
  (this->stateVariables).items = ppVar2;
  return (pool_ptr<soul::heart::Variable>)(Variable *)this;
}

Assistant:

pool_ptr<heart::Variable> Module::StateVariables::find (std::string_view name) const
{
    for (auto& v : stateVariables)
        if (v->name == name)
            return v;

    return {};
}